

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RsRepeatSyntax::setChild(RsRepeatSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_002315ec + *(int *)(&DAT_002315ec + index * 4)))();
  return;
}

Assistant:

void RsRepeatSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}